

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# evutil.c
# Opt level: O0

int evutil_accept4_(int sockfd,sockaddr *addr,socklen_t *addrlen,int flags)

{
  int iVar1;
  int *piVar2;
  int result;
  int flags_local;
  socklen_t *addrlen_local;
  sockaddr *addr_local;
  int sockfd_local;
  
  addr_local._4_4_ = accept4(sockfd,(sockaddr *)addr,addrlen,flags);
  if ((addr_local._4_4_ < 0) &&
     (((piVar2 = __errno_location(), *piVar2 == 0x16 ||
       (piVar2 = __errno_location(), *piVar2 == 0x26)) &&
      (addr_local._4_4_ = accept(sockfd,(sockaddr *)addr,addrlen), -1 < addr_local._4_4_)))) {
    if (((flags & 0x80000U) == 0) ||
       (iVar1 = evutil_fast_socket_closeonexec(addr_local._4_4_), -1 < iVar1)) {
      if (((flags & 0x800U) != 0) &&
         (iVar1 = evutil_fast_socket_nonblocking(addr_local._4_4_), iVar1 < 0)) {
        evutil_closesocket(addr_local._4_4_);
        addr_local._4_4_ = -1;
      }
    }
    else {
      evutil_closesocket(addr_local._4_4_);
      addr_local._4_4_ = -1;
    }
  }
  return addr_local._4_4_;
}

Assistant:

evutil_socket_t
evutil_accept4_(evutil_socket_t sockfd, struct sockaddr *addr,
    ev_socklen_t *addrlen, int flags)
{
	evutil_socket_t result;
#if defined(EVENT__HAVE_ACCEPT4) && defined(SOCK_CLOEXEC) && defined(SOCK_NONBLOCK)
	result = accept4(sockfd, addr, addrlen, flags);
	if (result >= 0 || (errno != EINVAL && errno != ENOSYS)) {
		/* A nonnegative result means that we succeeded, so return.
		 * Failing with EINVAL means that an option wasn't supported,
		 * and failing with ENOSYS means that the syscall wasn't
		 * there: in those cases we want to fall back.  Otherwise, we
		 * got a real error, and we should return. */
		return result;
	}
#endif
	result = accept(sockfd, addr, addrlen);
	if (result < 0)
		return result;

	if (flags & EVUTIL_SOCK_CLOEXEC) {
		if (evutil_fast_socket_closeonexec(result) < 0) {
			evutil_closesocket(result);
			return -1;
		}
	}
	if (flags & EVUTIL_SOCK_NONBLOCK) {
		if (evutil_fast_socket_nonblocking(result) < 0) {
			evutil_closesocket(result);
			return -1;
		}
	}
	return result;
}